

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer,UseMemoization useMemoization)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  JavaType JVar4;
  Label LVar5;
  int iVar6;
  char *pcVar7;
  Descriptor *pDVar8;
  FieldDescriptor *field_00;
  Descriptor *descriptor;
  FieldDescriptor *field_01;
  Descriptor *descriptor_00;
  FieldDescriptor *field_02;
  Descriptor *descriptor_01;
  FieldDescriptor *field_03;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0;
  string local_180;
  allocator<char> local_159;
  string local_158;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  FieldDescriptor *local_90;
  FieldDescriptor *field_1;
  int i_1;
  allocator<char> local_71;
  string local_70;
  string local_50;
  java *local_30;
  FieldDescriptor *field;
  byte local_1d;
  int i;
  bool memoization;
  Printer *pPStack_18;
  UseMemoization useMemoization_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_1d = useMemoization == MEMOIZE;
  i = useMemoization;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  if ((bool)local_1d) {
    io::Printer::Print(printer,"private byte memoizedIsInitialized = -1;\n");
  }
  io::Printer::Print(pPStack_18,"public final boolean isInitialized() {\n");
  io::Printer::Indent(pPStack_18);
  if ((local_1d & 1) != 0) {
    io::Printer::Print(pPStack_18,
                       "byte isInitialized = memoizedIsInitialized;\nif (isInitialized != -1) return isInitialized == 1;\n\n"
                      );
  }
  for (field._4_4_ = 0; iVar6 = field._4_4_, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar6 < iVar3; field._4_4_ = field._4_4_ + 1) {
    local_30 = (java *)Descriptor::field(this->descriptor_,field._4_4_);
    bVar2 = FieldDescriptor::is_required((FieldDescriptor *)local_30);
    pPVar1 = pPStack_18;
    if (bVar2) {
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_50,local_30,field_00);
      pcVar7 = "";
      if ((local_1d & 1) != 0) {
        pcVar7 = "memoizedIsInitialized = 0;";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar7,&local_71);
      io::Printer::Print(pPVar1,"if (!has$name$()) {\n  $memoize$\n  return false;\n}\n","name",
                         &local_50,"memoize",&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  for (field_1._0_4_ = 0; iVar6 = (int)field_1, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar6 < iVar3; field_1._0_4_ = (int)field_1 + 1) {
    local_90 = Descriptor::field(this->descriptor_,(int)field_1);
    JVar4 = GetJavaType(local_90);
    if (JVar4 == JAVATYPE_MESSAGE) {
      pDVar8 = FieldDescriptor::message_type(local_90);
      bVar2 = anon_unknown_5::HasRequiredFields(pDVar8);
      if (bVar2) {
        LVar5 = FieldDescriptor::label(local_90);
        pPVar1 = pPStack_18;
        if (LVar5 == LABEL_OPTIONAL) {
          pDVar8 = FieldDescriptor::message_type(local_90);
          ClassName_abi_cxx11_(&local_118,(java *)pDVar8,descriptor_00);
          UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_138,(java *)local_90,field_02);
          pcVar7 = "";
          if ((local_1d & 1) != 0) {
            pcVar7 = "memoizedIsInitialized = 0;";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar7,&local_159)
          ;
          io::Printer::Print(pPVar1,
                             "if (has$name$()) {\n  if (!get$name$().isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                             ,"type",&local_118,"name",&local_138,"memoize",&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_118);
        }
        else if (LVar5 == LABEL_REQUIRED) {
          pDVar8 = FieldDescriptor::message_type(local_90);
          ClassName_abi_cxx11_(&local_b0,(java *)pDVar8,descriptor);
          UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_d0,(java *)local_90,field_01);
          pcVar7 = "";
          if ((local_1d & 1) != 0) {
            pcVar7 = "memoizedIsInitialized = 0;";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar7,&local_f1);
          io::Printer::Print(pPVar1,
                             "if (!get$name$().isInitialized()) {\n  $memoize$\n  return false;\n}\n"
                             ,"type",&local_b0,"name",&local_d0,"memoize",&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator(&local_f1);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else if (LVar5 == LABEL_REPEATED) {
          pDVar8 = FieldDescriptor::message_type(local_90);
          ClassName_abi_cxx11_(&local_180,(java *)pDVar8,descriptor_01);
          UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_1a0,(java *)local_90,field_03);
          pcVar7 = "";
          if ((local_1d & 1) != 0) {
            pcVar7 = "memoizedIsInitialized = 0;";
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar7,&local_1c1)
          ;
          io::Printer::Print(pPVar1,
                             "for (int i = 0; i < get$name$Count(); i++) {\n  if (!get$name$(i).isInitialized()) {\n    $memoize$\n    return false;\n  }\n}\n"
                             ,"type",&local_180,"name",&local_1a0,"memoize",&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::allocator<char>::~allocator(&local_1c1);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_180);
        }
      }
    }
  }
  iVar6 = Descriptor::extension_range_count(this->descriptor_);
  pPVar1 = pPStack_18;
  if (0 < iVar6) {
    pcVar7 = "";
    if ((local_1d & 1) != 0) {
      pcVar7 = "memoizedIsInitialized = 0;";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar7,&local_1e9);
    io::Printer::Print(pPVar1,
                       "if (!extensionsAreInitialized()) {\n  $memoize$\n  return false;\n}\n",
                       "memoize",&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
  }
  io::Printer::Outdent(pPStack_18);
  if ((local_1d & 1) != 0) {
    io::Printer::Print(pPStack_18,"  memoizedIsInitialized = 1;\n");
  }
  io::Printer::Print(pPStack_18,"  return true;\n}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateIsInitialized(
    io::Printer* printer, UseMemoization useMemoization) {
  bool memoization = useMemoization == MEMOIZE;
  if (memoization) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). -1 means not yet computed. 0 means false and 1 means
    // true.
    printer->Print(
      "private byte memoizedIsInitialized = -1;\n");
  }
  printer->Print(
    "public final boolean isInitialized() {\n");
  printer->Indent();

  if (memoization) {
    printer->Print(
      "byte isInitialized = memoizedIsInitialized;\n"
      "if (isInitialized != -1) return isInitialized == 1;\n"
      "\n");
  }

  // Check that all required fields in this message are set.
  // TODO(kenton):  We can optimize this when we switch to putting all the
  //   "has" fields into a single bitfield.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_required()) {
      printer->Print(
        "if (!has$name$()) {\n"
        "  $memoize$\n"
        "  return false;\n"
        "}\n",
        "name", UnderscoresToCapitalizedCamelCase(field),
        "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
    }
  }

  // Now check that all embedded messages are initialized.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        HasRequiredFields(field->message_type())) {
      switch (field->label()) {
        case FieldDescriptor::LABEL_REQUIRED:
          printer->Print(
            "if (!get$name$().isInitialized()) {\n"
             "  $memoize$\n"
             "  return false;\n"
             "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_OPTIONAL:
          printer->Print(
            "if (has$name$()) {\n"
            "  if (!get$name$().isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
        case FieldDescriptor::LABEL_REPEATED:
          printer->Print(
            "for (int i = 0; i < get$name$Count(); i++) {\n"
            "  if (!get$name$(i).isInitialized()) {\n"
            "    $memoize$\n"
            "    return false;\n"
            "  }\n"
            "}\n",
            "type", ClassName(field->message_type()),
            "name", UnderscoresToCapitalizedCamelCase(field),
            "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
          break;
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!extensionsAreInitialized()) {\n"
      "  $memoize$\n"
      "  return false;\n"
      "}\n",
      "memoize", memoization ? "memoizedIsInitialized = 0;" : "");
  }

  printer->Outdent();

  if (memoization) {
    printer->Print(
      "  memoizedIsInitialized = 1;\n");
  }

  printer->Print(
    "  return true;\n"
    "}\n"
    "\n");
}